

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id3.c
# Opt level: O0

uint id3_fill_tframe(uchar *buf,uint len,char *type,uchar encoding,char *string)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  unsigned_long uVar4;
  uint flen;
  uint slen;
  uchar *ptr;
  char *string_local;
  uchar encoding_local;
  char *type_local;
  uint len_local;
  uchar *buf_local;
  
  if (buf == (uchar *)0x0) {
    __assert_fail("buf != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",0x47,
                  "unsigned int id3_fill_tframe(unsigned char *, unsigned int, char *, unsigned char, char *)"
                 );
  }
  if (len == 0) {
    __assert_fail("len > 0","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",
                  0x48,
                  "unsigned int id3_fill_tframe(unsigned char *, unsigned int, char *, unsigned char, char *)"
                 );
  }
  if (type == (char *)0x0) {
    __assert_fail("type != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",0x49,
                  "unsigned int id3_fill_tframe(unsigned char *, unsigned int, char *, unsigned char, char *)"
                 );
  }
  if (string != (char *)0x0) {
    sVar3 = strlen(string);
    iVar1 = (int)sVar3;
    uVar2 = iVar1 + 2;
    if (len < iVar1 + 8U) {
      buf_local._4_4_ = 0;
    }
    else {
      *(undefined2 *)buf = *(undefined2 *)type;
      buf[2] = type[2];
      uVar4 = id3_sync_safe((ulong)uVar2);
      buf[3] = (uchar)(uVar4 >> 0x10);
      uVar4 = id3_sync_safe((ulong)uVar2);
      buf[4] = (uchar)(uVar4 >> 8);
      uVar4 = id3_sync_safe((ulong)uVar2);
      buf[5] = (uchar)uVar4;
      buf[6] = encoding;
      memcpy(buf + 7,string,sVar3 & 0xffffffff);
      (buf + 7)[sVar3 & 0xffffffff] = '\0';
      buf_local._4_4_ = iVar1 + 8;
    }
    return buf_local._4_4_;
  }
  __assert_fail("string != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",0x4a,
                "unsigned int id3_fill_tframe(unsigned char *, unsigned int, char *, unsigned char, char *)"
               );
}

Assistant:

unsigned int id3_fill_tframe(unsigned char *buf, unsigned int len,
                             char *type,
                             unsigned char encoding,
                             char *string) {
  assert(buf != NULL);
  assert(len > 0);
  assert(type != NULL);
  assert(string != NULL);

  unsigned char *ptr = buf;
  unsigned int slen = strlen(string);
  unsigned int flen = slen + 2;
  if (len < 6 + flen)
    return 0;
  memcpy(ptr, type, 3); ptr += 3;
  UINT24_PACK(ptr, id3_sync_safe(flen));
  UINT8_PACK(ptr, encoding);
  memcpy(ptr, string, slen); ptr += slen;
  UINT8_PACK(ptr, 0x00);

  return flen + 6;
}